

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::TiledRgbaInputFile::readTiles
          (TiledRgbaInputFile *this,int dxMin,int dxMax,int dyMin,int dyMax,int lx,int ly)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int dx;
  int dy;
  lock_guard<std::mutex> lock;
  int in_stack_000001b0;
  int in_stack_000001b4;
  int in_stack_000001b8;
  int in_stack_000001bc;
  FromYa *in_stack_000001c0;
  int in_stack_0000032c;
  int in_stack_00000330;
  int in_stack_00000334;
  int in_stack_00000338;
  int in_stack_0000033c;
  TiledInputFile *in_stack_00000340;
  int in_stack_00000350;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  lock_guard<std::mutex> *in_stack_ffffffffffffffb0;
  undefined4 local_30;
  undefined4 local_2c;
  
  if (*(long *)(in_RDI + 0x10) == 0) {
    TiledInputFile::readTiles
              (in_stack_00000340,in_stack_0000033c,in_stack_00000338,in_stack_00000334,
               in_stack_00000330,in_stack_0000032c,in_stack_00000350);
  }
  else {
    std::lock_guard<std::mutex>::lock_guard
              (in_stack_ffffffffffffffb0,
               (mutex_type *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    for (local_2c = in_ECX; local_30 = in_ESI, local_2c <= in_R8D; local_2c = local_2c + 1) {
      for (; local_30 <= in_EDX; local_30 = local_30 + 1) {
        FromYa::readTile(in_stack_000001c0,in_stack_000001bc,in_stack_000001b8,in_stack_000001b4,
                         in_stack_000001b0);
      }
    }
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x24e562);
  }
  return;
}

Assistant:

void
TiledRgbaInputFile::readTiles (
    int dxMin, int dxMax, int dyMin, int dyMax, int lx, int ly)
{
    if (_fromYa)
    {
#if ILMTHREAD_THREADING_ENABLED
        std::lock_guard<std::mutex> lock (*_fromYa);
#endif
        for (int dy = dyMin; dy <= dyMax; dy++)
            for (int dx = dxMin; dx <= dxMax; dx++)
                _fromYa->readTile (dx, dy, lx, ly);
    }
    else { _inputFile->readTiles (dxMin, dxMax, dyMin, dyMax, lx, ly); }
}